

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vpsllvw_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.W == '\x01') {
        (pMyDisasm->Instruction).Category = 0x140000;
        strcpy((pMyDisasm->Instruction).Mnemonic,"vpsllvw");
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
        ArgsVEX(pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x02') {
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        (pMyDisasm->Instruction).Category = 0x140000;
        strcpy((pMyDisasm->Instruction).Mnemonic,"vpmovusqb");
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x0e';
        vex_ExG(pMyDisasm,2,3,4,4,4,4);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vpsllvw_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 1) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpsllvw");
        #endif
        GV.EVEX.tupletype = FULL_MEM;
        ArgsVEX(pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.VEX.pp == 2) {
      if (GV.EVEX.W == 0) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmovusqb");
        #endif
        GV.EVEX.tupletype = EIGHTH_MEM;
        vex_ExG(pMyDisasm, Arg1word, Arg1dword, Arg1qword, SSE_REG, SSE_REG, SSE_REG);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}